

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::SourceRange>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::SourceRange>,448ul,16ul>>
::nosize_unchecked_emplace_at<std::pair<slang::ConstantValue&&,slang::SourceRange&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::SourceRange>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::SourceRange>,448ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<slang::ConstantValue_&&,_slang::SourceRange_&&> *args)

{
  group_type_pointer pgVar1;
  value_type_pointer this_00;
  SourceRange *pSVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  SourceLocation SVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  slot_type *local_40;
  
  pgVar3 = arrays_->groups_;
  lVar10 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar12[0] = -(pgVar1->m[0].n == '\0');
  auVar12[1] = -(pgVar1->m[1].n == '\0');
  auVar12[2] = -(pgVar1->m[2].n == '\0');
  auVar12[3] = -(pgVar1->m[3].n == '\0');
  auVar12[4] = -(pgVar1->m[4].n == '\0');
  auVar12[5] = -(pgVar1->m[5].n == '\0');
  auVar12[6] = -(pgVar1->m[6].n == '\0');
  auVar12[7] = -(pgVar1->m[7].n == '\0');
  auVar12[8] = -(pgVar1->m[8].n == '\0');
  auVar12[9] = -(pgVar1->m[9].n == '\0');
  auVar12[10] = -(pgVar1->m[10].n == '\0');
  auVar12[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar12[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar12[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar12[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar12[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar9 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
  if (uVar9 == 0) {
    uVar5 = arrays_->groups_size_mask;
    lVar11 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar11 & uVar5;
      lVar10 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar13[0] = -(pgVar1->m[0].n == '\0');
      auVar13[1] = -(pgVar1->m[1].n == '\0');
      auVar13[2] = -(pgVar1->m[2].n == '\0');
      auVar13[3] = -(pgVar1->m[3].n == '\0');
      auVar13[4] = -(pgVar1->m[4].n == '\0');
      auVar13[5] = -(pgVar1->m[5].n == '\0');
      auVar13[6] = -(pgVar1->m[6].n == '\0');
      auVar13[7] = -(pgVar1->m[7].n == '\0');
      auVar13[8] = -(pgVar1->m[8].n == '\0');
      auVar13[9] = -(pgVar1->m[9].n == '\0');
      auVar13[10] = -(pgVar1->m[10].n == '\0');
      auVar13[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar13[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar13[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar13[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar13[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar7 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
      uVar9 = (uint)uVar7;
      lVar11 = lVar11 + 1;
    } while (uVar7 == 0);
  }
  local_40 = pgVar3->m + lVar10;
  ppVar4 = arrays_->elements_;
  uVar6 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  this_00 = ppVar4 + pos0 * 0xf + (ulong)uVar6;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)this_00,
                    (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)args->first);
  SVar8 = args->second->endLoc;
  pSVar2 = &ppVar4[pos0 * 0xf + (ulong)uVar6].second;
  pSVar2->startLoc = args->second->startLoc;
  pSVar2->endLoc = SVar8;
  local_40[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_40;
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p = this_00;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }